

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O3

void SUNBandMatrix_Print(SUNMatrix A,FILE *outfile)

{
  uint uVar1;
  SUNMatrix_ID SVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long local_50;
  
  SVar2 = SUNMatGetID(A);
  if (SVar2 != SUNMATRIX_BAND) {
    return;
  }
  fputc(10,(FILE *)outfile);
  piVar4 = (int *)A->content;
  if (0 < *piVar4) {
    local_50 = 0;
    iVar7 = 0;
    lVar6 = 0;
    do {
      uVar8 = (int)lVar6 - piVar4[4];
      uVar5 = (ulong)uVar8;
      iVar3 = piVar4[3] + (int)lVar6;
      iVar10 = piVar4[1] + -1;
      if (iVar3 < piVar4[1]) {
        iVar10 = iVar3;
      }
      uVar1 = 0;
      if (0 < (int)uVar8) {
        iVar3 = piVar4[4] + iVar7;
        do {
          fprintf((FILE *)outfile,"%12s  ","");
          iVar3 = iVar3 + 1;
          uVar1 = uVar8;
        } while (iVar3 != 0);
      }
      if ((int)uVar1 <= iVar10) {
        if ((int)uVar8 < 1) {
          uVar5 = 0;
        }
        lVar11 = uVar5 - 1;
        lVar9 = local_50 + uVar5 * -8;
        do {
          fprintf((FILE *)outfile,"%12g  ",
                  *(undefined8 *)
                   (lVar9 + (long)*(int *)((long)A->content + 0x14) * 8 +
                            *(long *)(*(long *)((long)A->content + 0x28) + 8 + lVar11 * 8)));
          lVar11 = lVar11 + 1;
          lVar9 = lVar9 + -8;
        } while (lVar11 < iVar10);
      }
      fputc(10,(FILE *)outfile);
      lVar6 = lVar6 + 1;
      piVar4 = (int *)A->content;
      iVar7 = iVar7 + -1;
      local_50 = local_50 + 8;
    } while (lVar6 < *piVar4);
  }
  fputc(10,(FILE *)outfile);
  return;
}

Assistant:

void SUNBandMatrix_Print(SUNMatrix A, FILE* outfile)
{
  sunindextype i, j, start, finish;

  /* should not be called unless A is a band matrix;
     otherwise return immediately */
  if (SUNMatGetID(A) != SUNMATRIX_BAND)
    return;

  /* perform operation */
  fprintf(outfile,"\n");
  for (i=0; i<SM_ROWS_B(A); i++) {
    start = SUNMAX(0, i-SM_LBAND_B(A));
    finish = SUNMIN(SM_COLUMNS_B(A)-1, i+SM_UBAND_B(A));
    for (j=0; j<start; j++)
      fprintf(outfile,"%12s  ","");
    for (j=start; j<=finish; j++) {
#if defined(SUNDIALS_EXTENDED_PRECISION)
      fprintf(outfile,"%12Lg  ", SM_ELEMENT_B(A,i,j));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
      fprintf(outfile,"%12g  ", SM_ELEMENT_B(A,i,j));
#else
      fprintf(outfile,"%12g  ", SM_ELEMENT_B(A,i,j));
#endif
    }
    fprintf(outfile,"\n");
  }
  fprintf(outfile,"\n");
  return;
}